

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O2

int CfdGetPegoutAddress(void *handle,int mainchain_network,int elements_network,char *descriptor,
                       uint32_t bip32_counter,int address_type,char **mainchain_address,
                       char **base_descriptor)

{
  bool bVar1;
  NetType mainchain_network_00;
  NetType elements_network_00;
  AddressType address_type_00;
  char *pcVar2;
  char *pcVar3;
  CfdException *this;
  allocator local_349;
  void *local_348;
  string local_340;
  char *work_address;
  undefined8 local_318;
  Address addr;
  Descriptor desc;
  
  work_address = (char *)0x0;
  local_318 = 0;
  local_348 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(descriptor);
  if (!bVar1) {
    mainchain_network_00 = cfd::capi::ConvertNetType(mainchain_network,(bool *)0x0);
    elements_network_00 = cfd::capi::ConvertNetType(elements_network,(bool *)0x0);
    address_type_00 = cfd::capi::ConvertAddressType(address_type);
    cfd::core::Descriptor::Descriptor(&desc);
    std::__cxx11::string::string((string *)&local_340,descriptor,&local_349);
    cfd::ElementsAddressFactory::CreatePegOutAddress
              (&addr,mainchain_network_00,elements_network_00,&local_340,bip32_counter,
               address_type_00,&desc);
    std::__cxx11::string::~string((string *)&local_340);
    if (mainchain_address == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_340,&addr);
      pcVar2 = cfd::capi::CreateString(&local_340);
      work_address = pcVar2;
      std::__cxx11::string::~string((string *)&local_340);
    }
    if (base_descriptor != (char **)0x0) {
      cfd::core::Descriptor::ToString_abi_cxx11_(&local_340,&desc,false);
      pcVar3 = cfd::capi::CreateString(&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      *base_descriptor = pcVar3;
    }
    if (mainchain_address != (char **)0x0) {
      *mainchain_address = pcVar2;
    }
    cfd::core::Address::~Address(&addr);
    cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
    return 0;
  }
  addr._0_8_ = (long)
               "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
               + 0x56;
  addr.witness_ver_ = 0xf8;
  addr.address_._M_dataplus._M_p = "CfdGetPegoutAddress";
  cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"descriptor is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&addr,"Failed to parameter. descriptor is null or empty.",(allocator *)&desc)
  ;
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&addr);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPegoutAddress(
    void* handle, int mainchain_network, int elements_network,
    const char* descriptor, uint32_t bip32_counter, int address_type,
    char** mainchain_address, char** base_descriptor) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_descriptor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(descriptor)) {
      warn(CFD_LOG_SOURCE, "descriptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null or empty.");
    }

    auto mainchain_net_type = ConvertNetType(mainchain_network, nullptr);
    auto elements_net_type = ConvertNetType(elements_network, nullptr);
    auto addr_type = ConvertAddressType(address_type);
    Descriptor desc;
    auto addr = ElementsAddressFactory::CreatePegOutAddress(
        mainchain_net_type, elements_net_type, descriptor, bip32_counter,
        addr_type, &desc);
    if (mainchain_address != nullptr) {
      work_address = CreateString(addr.GetAddress());
    }
    if (base_descriptor != nullptr) {
      work_descriptor = CreateString(desc.ToString(false));
    }

    if (base_descriptor != nullptr) *base_descriptor = work_descriptor;
    if (mainchain_address != nullptr) *mainchain_address = work_address;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_descriptor);
  return result;
}